

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O1

int parseHeaderName(QByteArrayView headerName)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  
  pcVar5 = headerName.m_data;
  lVar6 = headerName.m_size;
  iVar4 = -1;
  if (lVar6 != 0) {
    uVar1 = (uint)*pcVar5;
    uVar3 = uVar1 + 0x20 & 0xff;
    if (0x19 < uVar1 - 0x41) {
      uVar3 = uVar1;
    }
    uVar3 = uVar3 & 0xff;
    switch(uVar3) {
    case 99:
      iVar2 = qstrnicmp(pcVar5,lVar6,"content-type",0xc);
      if (iVar2 == 0) {
        iVar4 = 0;
      }
      else {
        iVar2 = qstrnicmp(pcVar5,lVar6,"content-length",0xe);
        if (iVar2 == 0) {
          iVar4 = 1;
        }
        else {
          iVar2 = qstrnicmp(pcVar5,lVar6,"cookie",6);
          if (iVar2 == 0) {
            iVar4 = 4;
          }
          else {
            iVar2 = qstrnicmp(pcVar5,lVar6,"content-disposition",0x13);
            if (iVar2 == 0) {
              iVar4 = 6;
            }
          }
        }
      }
      break;
    case 100:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
      break;
    case 0x65:
      iVar2 = qstrnicmp(pcVar5,lVar6,"etag",4);
      if (iVar2 == 0) {
        iVar4 = 10;
      }
      break;
    case 0x69:
      iVar2 = qstrnicmp(pcVar5,lVar6,"if-modified-since",0x11);
      if (iVar2 == 0) {
        iVar4 = 9;
      }
      else {
        iVar2 = qstrnicmp(pcVar5,lVar6,"if-match",8);
        if (iVar2 == 0) {
          iVar4 = 0xb;
        }
        else {
          iVar2 = qstrnicmp(pcVar5,lVar6,"if-none-match",0xd);
          if (iVar2 == 0) {
            iVar4 = 0xc;
          }
        }
      }
      break;
    case 0x6c:
      iVar2 = qstrnicmp(pcVar5,lVar6,"location",8);
      if (iVar2 == 0) {
        iVar4 = 2;
      }
      else {
        iVar2 = qstrnicmp(pcVar5,lVar6,"last-modified",0xd);
        if (iVar2 == 0) {
          iVar4 = 3;
        }
      }
      break;
    default:
      if (uVar3 == 0x73) {
        iVar2 = qstrnicmp(pcVar5,lVar6,"set-cookie",10);
        if (iVar2 == 0) {
          iVar4 = 5;
        }
        else {
          iVar2 = qstrnicmp(pcVar5,lVar6,"server",6);
          if (iVar2 == 0) {
            iVar4 = 8;
          }
        }
      }
      else if ((uVar3 == 0x75) && (iVar2 = qstrnicmp(pcVar5,lVar6,"user-agent",10), iVar2 == 0)) {
        iVar4 = 7;
      }
    }
  }
  return iVar4;
}

Assistant:

static int parseHeaderName(QByteArrayView headerName)
{
    if (headerName.isEmpty())
        return -1;

    auto is = [headerName](QByteArrayView what) {
        return headerName.compare(what, Qt::CaseInsensitive) == 0;
    };

    switch (QtMiscUtils::toAsciiLower(headerName.front())) {
    case 'c':
        if (is("content-type"))
            return QNetworkRequest::ContentTypeHeader;
        else if (is("content-length"))
            return QNetworkRequest::ContentLengthHeader;
        else if (is("cookie"))
            return QNetworkRequest::CookieHeader;
        else if (is("content-disposition"))
            return QNetworkRequest::ContentDispositionHeader;
        break;

    case 'e':
        if (is("etag"))
            return QNetworkRequest::ETagHeader;
        break;

    case 'i':
        if (is("if-modified-since"))
            return QNetworkRequest::IfModifiedSinceHeader;
        if (is("if-match"))
            return QNetworkRequest::IfMatchHeader;
        if (is("if-none-match"))
            return QNetworkRequest::IfNoneMatchHeader;
        break;

    case 'l':
        if (is("location"))
            return QNetworkRequest::LocationHeader;
        else if (is("last-modified"))
            return QNetworkRequest::LastModifiedHeader;
        break;

    case 's':
        if (is("set-cookie"))
            return QNetworkRequest::SetCookieHeader;
        else if (is("server"))
            return QNetworkRequest::ServerHeader;
        break;

    case 'u':
        if (is("user-agent"))
            return QNetworkRequest::UserAgentHeader;
        break;
    }

    return -1; // nothing found
}